

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesFabricPortGetMultiPortThroughput
          (zes_device_handle_t hDevice,uint32_t numPorts,zes_fabric_port_handle_t *phPort,
          zes_fabric_port_throughput_t **pThroughput)

{
  code *pcVar1;
  undefined8 uVar2;
  ulong uVar3;
  void *pvVar4;
  ulong local_58;
  size_t i;
  zes_fabric_port_handle_t *phPortLocal;
  zes_pfnFabricPortGetMultiPortThroughput_t pfnGetMultiPortThroughput;
  dditable_t *dditable;
  ze_result_t result;
  zes_fabric_port_throughput_t **pThroughput_local;
  zes_fabric_port_handle_t *phPort_local;
  uint32_t numPorts_local;
  zes_device_handle_t hDevice_local;
  
  pcVar1 = *(code **)(*(long *)(hDevice + 8) + 0xc10);
  if (pcVar1 == (code *)0x0) {
    hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    uVar2 = *(undefined8 *)hDevice;
    uVar3 = SUB168(ZEXT416(numPorts) * ZEXT816(8),0);
    if (SUB168(ZEXT416(numPorts) * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    for (local_58 = 0; phPort != (zes_fabric_port_handle_t *)0x0 && local_58 < numPorts;
        local_58 = local_58 + 1) {
      *(undefined8 *)((long)pvVar4 + local_58 * 8) = *(undefined8 *)phPort[local_58];
    }
    hDevice_local._4_4_ = (*pcVar1)(uVar2,numPorts,pvVar4,pThroughput);
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
  }
  return hDevice_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFabricPortGetMultiPortThroughput(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t numPorts,                              ///< [in] Number of ports enumerated in function ::zesDeviceEnumFabricPorts
        zes_fabric_port_handle_t* phPort,               ///< [in][range(0, numPorts)] array of fabric port handles provided by user
                                                        ///< to gather throughput values. 
        zes_fabric_port_throughput_t** pThroughput      ///< [out][range(0, numPorts)] array of fabric port throughput counters
                                                        ///< from multiple ports of type ::zes_fabric_port_throughput_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_device_object_t*>( hDevice )->dditable;
        auto pfnGetMultiPortThroughput = dditable->zes.FabricPort.pfnGetMultiPortThroughput;
        if( nullptr == pfnGetMultiPortThroughput )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<zes_device_object_t*>( hDevice )->handle;

        // convert loader handles to driver handles
        auto phPortLocal = new zes_fabric_port_handle_t [numPorts];
        for( size_t i = 0; ( nullptr != phPort ) && ( i < numPorts ); ++i )
            phPortLocal[ i ] = reinterpret_cast<zes_fabric_port_object_t*>( phPort[ i ] )->handle;

        // forward to device-driver
        result = pfnGetMultiPortThroughput( hDevice, numPorts, phPortLocal, pThroughput );
        delete []phPortLocal;

        return result;
    }